

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Ptr_t *
Acb_GenerateSignalNames
          (Acb_Ntk_t *p,Vec_Int_t *vDivs,Vec_Int_t *vUsed,int nNodes,Vec_Int_t *vTars,
          Vec_Wec_t *vGates)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Vec_Str_t *p_01;
  char *pcVar3;
  Vec_Int_t *p_02;
  void *pvVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = (long)nNodes + (long)vUsed->nSize;
  iVar5 = (int)lVar6;
  p_00 = Vec_PtrAlloc(iVar5);
  p_00->nSize = iVar5;
  memset(p_00->pArray,0,lVar6 * 8);
  p_01 = Vec_StrAlloc(1000);
  for (iVar5 = 0; iVar5 < vUsed->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vUsed,iVar5);
    iVar1 = Vec_IntEntry(vDivs,iVar1);
    pcVar3 = Acb_ObjNameStr(p,iVar1);
    pcVar3 = Abc_UtilStrsav(pcVar3);
    Vec_PtrWriteEntry(p_00,iVar5,pcVar3);
  }
  iVar5 = vTars->nSize;
  if (vGates->nSize == vUsed->nSize + nNodes + iVar5) {
    iVar1 = 0;
    while( true ) {
      if (iVar5 <= iVar1) {
        iVar5 = vUsed->nSize;
        for (iVar1 = iVar5; iVar1 < iVar5 + nNodes; iVar1 = iVar1 + 1) {
          pvVar4 = Vec_PtrEntry(p_00,iVar1);
          if (pvVar4 == (void *)0x0) {
            Vec_StrPrintF(p_01,"ww%d");
            Vec_StrPush(p_01,'\0');
            pcVar3 = p_01->pArray;
            p_01->nCap = 0;
            p_01->nSize = 0;
            p_01->pArray = (char *)0x0;
            Vec_PtrWriteEntry(p_00,iVar1,pcVar3);
          }
          iVar5 = vUsed->nSize;
        }
        Vec_StrFree(p_01);
        return p_00;
      }
      iVar5 = Vec_IntEntry(vTars,iVar1);
      p_02 = Vec_WecEntry(vGates,nNodes + iVar1 + vUsed->nSize);
      iVar2 = Vec_IntEntry(p_02,0);
      if (iVar2 != 0xb) break;
      iVar2 = Vec_IntEntry(p_02,1);
      pcVar3 = Acb_ObjNameStr(p,iVar5);
      pcVar3 = Abc_UtilStrsav(pcVar3);
      Vec_PtrWriteEntry(p_00,iVar2,pcVar3);
      iVar1 = iVar1 + 1;
      iVar5 = vTars->nSize;
    }
    __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                  ,0x72f,
                  "Vec_Ptr_t *Acb_GenerateSignalNames(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  __assert_fail("Vec_WecSize(vGates) == Vec_IntSize(vUsed) + nNodes + Vec_IntSize(vTars)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                ,0x72b,
                "Vec_Ptr_t *Acb_GenerateSignalNames(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
               );
}

Assistant:

Vec_Ptr_t * Acb_GenerateSignalNames( Acb_Ntk_t * p, Vec_Int_t * vDivs, Vec_Int_t * vUsed, int nNodes, Vec_Int_t * vTars, Vec_Wec_t * vGates )
{
    Vec_Ptr_t * vRes = Vec_PtrStart( Vec_IntSize(vUsed) + nNodes );
    Vec_Str_t * vStr = Vec_StrAlloc(1000); int i, iObj, nWires = 1;
    // create input names
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_PtrWriteEntry( vRes, i, Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
    // create names for nodes driving outputs
    assert( Vec_WecSize(vGates) == Vec_IntSize(vUsed) + nNodes + Vec_IntSize(vTars) );
    Vec_IntForEachEntry( vTars, iObj, i )
    {
        Vec_Int_t * vGate = Vec_WecEntry( vGates, Vec_IntSize(vUsed) + nNodes + i );
        assert( Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF );
        Vec_PtrWriteEntry( vRes, Vec_IntEntry(vGate, 1), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
    }
    for ( i = Vec_IntSize(vUsed); i < Vec_IntSize(vUsed) + nNodes; i++ )
        if ( Vec_PtrEntry(vRes, i) == NULL )
        {
            Vec_StrPrintF( vStr, "ww%d", nWires++ );
            Vec_StrPush( vStr, '\0' );
            Vec_PtrWriteEntry( vRes, i, Vec_StrReleaseArray(vStr) );
        }
    Vec_StrFree( vStr );
    return vRes;
}